

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

FMFormat EVget_src_ref_format(EVsource source)

{
  CManager cm;
  FMFormat p_Var1;
  
  cm = source->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x516);
  p_Var1 = INT_EVget_src_ref_format(source);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x518);
  return p_Var1;
}

Assistant:

extern FMFormat
EVget_src_ref_format ( EVsource source )
{
	FMFormat ret;
	CManager cm = source->cm;
	CManager_lock(cm);
	ret = INT_EVget_src_ref_format(source);
	CManager_unlock(cm);
	return ret;
}